

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

FT_UShort __thiscall
FreeTypeFaceWrapper::GetInPDFMeasurements(FreeTypeFaceWrapper *this,FT_UShort inFontMeasurement)

{
  ushort uVar1;
  
  if (this->mFace != (FT_Face)0x0) {
    uVar1 = this->mFace->units_per_EM;
    if (uVar1 != 1000) {
      inFontMeasurement = (FT_UShort)(int)(((double)inFontMeasurement * 1000.0) / (double)uVar1);
    }
    return inFontMeasurement;
  }
  return 0;
}

Assistant:

FT_UShort FreeTypeFaceWrapper::GetInPDFMeasurements(FT_UShort inFontMeasurement)
{
	if(mFace)
	{
		if(1000 == mFace->units_per_EM)
			return inFontMeasurement;
		else
			return FT_UShort((double)inFontMeasurement * 1000.0 / mFace->units_per_EM);
	}
	else
		return 0;
}